

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

void __thiscall wasm::Literal::Literal(Literal *this,Name func,HeapType type)

{
  bool bVar1;
  HeapType local_18;
  HeapType type_local;
  
  (this->field_0).i64 = func.super_IString.str._M_len;
  (this->field_0).func.super_IString.str._M_str = func.super_IString.str._M_str;
  local_18.id = type.id;
  Type::Type(&this->type,type,NonNullable,Inexact);
  bVar1 = HeapType::isSignature(&local_18);
  if (bVar1) {
    return;
  }
  __assert_fail("type.isSignature()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x5c,"wasm::Literal::Literal(Name, HeapType)");
}

Assistant:

explicit Literal(Name func, HeapType type)
    : func(func), type(type, NonNullable) {
    assert(type.isSignature());
  }